

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S_Cone.cpp
# Opt level: O3

Point3 * __thiscall
sch::S_Cone::l_Support(Point3 *__return_storage_ptr__,S_Cone *this,Vector3 *v,int *param_2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = v->m_x;
  dVar3 = v->m_y;
  dVar4 = SQRT(dVar2 * dVar2 + dVar3 * dVar3);
  if (2.220446049250313e-16 <= dVar4) {
    if (v->m_z < -this->angleTan_ * dVar4) goto LAB_0017889d;
    dVar1 = this->baseRadius_;
    __return_storage_ptr__->m_x = dVar1 * (1.0 / dVar4) * dVar2;
    __return_storage_ptr__->m_y = dVar1 * (1.0 / dVar4) * dVar3;
  }
  else {
    if (v->m_z < 0.0) {
LAB_0017889d:
      __return_storage_ptr__->m_x = 0.0;
      __return_storage_ptr__->m_y = 0.0;
      __return_storage_ptr__->m_z = 0.0;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->m_x = 0.0;
    __return_storage_ptr__->m_y = 0.0;
  }
  __return_storage_ptr__->m_z = this->height_;
  return __return_storage_ptr__;
}

Assistant:

Point3 S_Cone::l_Support(const Vector3 & v, int & /*lastFeature*/) const
{
  Scalar norm = sqrt(v[0] * v[0] + v[1] * v[1]);
  if(norm < sch::epsilon)
  {
    if(v[2] >= 0)
    {
      return Point3(0., 0., height_);
    }
    else
    {
      return Point3(0., 0., 0.);
    }
  }
  else
  {
    if(v[2] < -angleTan_ * norm)
    {
      return Point3(0., 0., 0.);
    }
    else
    {
      Scalar normInverse = 1 / norm;
      return Point3(normInverse * v[0] * baseRadius_, normInverse * v[1] * baseRadius_, height_);
    }
  }
}